

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O1

Event __thiscall Storage::Disk::PCMSegmentEventSource::get_next_event(PCMSegmentEventSource *this)

{
  Time *pTVar1;
  ulong uVar2;
  ulong uVar3;
  element_type *peVar4;
  long lVar5;
  _Bit_type *p_Var6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  unsigned_long uVar11;
  size_t sVar12;
  ulong uVar13;
  Event EVar14;
  
  uVar3 = this->bit_pointer_;
  uVar8 = 0;
  if (uVar3 == 0) {
    uVar8 = -((((this->segment_).
                super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              length_of_a_bit).length >> 1);
  }
  (this->next_event_).length.length = uVar8;
  peVar4 = (this->segment_).
           super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar5 = *(long *)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start;
  lVar9 = (long)(((_Bit_iterator *)
                 ((long)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p - lVar5;
  uVar2 = (ulong)*(uint *)((long)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data + 0x18) + lVar9 * 8;
  uVar8 = (this->next_event_).length.clock_rate;
  uVar11 = (this->lfsr_).value_;
  sVar12 = this->bit_pointer_;
  do {
    if (uVar2 <= sVar12) {
      (this->next_event_).type = IndexHole;
      if (uVar3 <= uVar2) {
        pTVar1 = &(this->next_event_).length;
        pTVar1->length = pTVar1->length + ((peVar4->length_of_a_bit).length >> 1);
        this->bit_pointer_ = sVar12 + 1;
      }
      lVar9._0_4_ = (this->next_event_).type;
      lVar9._4_4_ = (this->next_event_).length.length;
      uVar8 = (this->next_event_).length.clock_rate;
      break;
    }
    uVar13 = sVar12 + 0x3f;
    if (-1 < (long)sVar12) {
      uVar13 = sVar12;
    }
    uVar10 = *(ulong *)(lVar5 + ((long)uVar13 >> 6) * 8 + -8 +
                       (ulong)((sVar12 & 0x800000000000003f) < 0x8000000000000001) * 8);
    uVar13 = sVar12 + 1;
    this->bit_pointer_ = uVar13;
    pTVar1 = &(this->next_event_).length;
    pTVar1->length = pTVar1->length + (peVar4->length_of_a_bit).length;
    if ((uVar10 >> (sVar12 & 0x3f) & 1) == 0) {
      p_Var6 = *(_Bit_type **)
                &(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start;
      bVar7 = true;
      if ((p_Var6 != (((_Bit_iterator *)
                      ((long)&(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data + 0x10))->super__Bit_iterator_base).
                     _M_p) ||
         (*(uint *)((long)&(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data + 0x18) != 0)) {
        uVar10 = sVar12 + 0x40;
        if (-1 < (long)uVar13) {
          uVar10 = uVar13;
        }
        if ((p_Var6[((long)uVar10 >> 6) +
                    ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (uVar13 & 0x3f) & 1) != 0) {
          uVar10 = (ulong)((uint)uVar11 & 1);
          uVar11 = uVar11 >> 1 ^ uVar10 * -0x7fffffffffffe61e;
          (this->lfsr_).value_ = uVar11;
          if (uVar10 != 0) goto LAB_00449715;
        }
      }
    }
    else {
LAB_00449715:
      lVar9._0_4_ = (this->next_event_).type;
      lVar9._4_4_ = (this->next_event_).length.length;
      bVar7 = false;
    }
    sVar12 = uVar13;
  } while (bVar7);
  EVar14.length.clock_rate = uVar8;
  EVar14.type = (int)lVar9;
  EVar14.length.length = (int)((ulong)lVar9 >> 0x20);
  return EVar14;
}

Assistant:

Storage::Disk::Track::Event PCMSegmentEventSource::get_next_event() {
	// Track the initial bit pointer for potentially considering whether this was an
	// initial index hole or a subsequent one later on.
	const std::size_t initial_bit_pointer = bit_pointer_;

	// If starting from the beginning, pull half a bit backward, as if the initial bit
	// is set, it should be in the centre of its window.
	next_event_.length.length = bit_pointer_ ? 0 : -(segment_->length_of_a_bit.length >> 1);

	// search for the next bit that is set, if any
	while(bit_pointer_ < segment_->data.size()) {
		bool bit = segment_->data[bit_pointer_];
		++bit_pointer_;	// so this always points one beyond the most recent bit returned
		next_event_.length.length += segment_->length_of_a_bit.length;

		// if this bit is set, or is fuzzy and a random bit of 1 is selected, return the event.
		if(bit ||
			(!segment_->fuzzy_mask.empty() && segment_->fuzzy_mask[bit_pointer_] && lfsr_.next())
		)	return next_event_;
	}

	// If the end is reached without a bit being set, it'll be index holes from now on.
	next_event_.type = Track::Event::IndexHole;

	// Test whether this is the very first time that bits have been exhausted. If so then
	// allow an extra half bit's length to run from the position of the potential final transition
	// event to the end of the segment. Otherwise don't allow any extra time, as it's already
	// been consumed.
	if(initial_bit_pointer <= segment_->data.size()) {
		next_event_.length.length += (segment_->length_of_a_bit.length >> 1);
		bit_pointer_++;
	}
	return next_event_;
}